

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O0

int main(void)

{
  test_add_user();
  test_delete_user_policy();
  test_get_user();
  test_get_user_policy();
  test_list_user_policies();
  test_list_users();
  test_put_user_policy();
  test_remove_user();
  return 0;
}

Assistant:

int main() {
  test_add_user();
  test_delete_user_policy();
  test_get_user();
  test_get_user_policy();
  test_list_user_policies();
  test_list_users();
  test_put_user_policy();
  test_remove_user();
}